

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnIndexedFuncRef(TypeChecker *this,Index *out_index)

{
  Result RVar1;
  Result RVar2;
  long *plVar3;
  char *in_RCX;
  long *plVar4;
  Type type;
  TypeVector actual;
  string message;
  Type local_80;
  void *local_78;
  undefined8 uStack_70;
  long local_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  RVar1 = PeekType(this,0,&local_80);
  if ((local_80.enum_ == Reference) || (local_80.enum_ == Any)) {
    if (RVar1.enum_ == Ok) {
      if (local_80.enum_ != Reference) {
        __assert_fail("enum_ == Enum::Reference",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/type.h"
                      ,0x84,"Index wabt::Type::GetReferenceIndex() const");
      }
      *out_index = local_80.type_index_;
      RVar1.enum_ = Ok;
    }
  }
  else {
    local_78 = (void *)0x0;
    uStack_70 = 0;
    local_68 = 0;
    if (RVar1.enum_ == Ok) {
      std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_realloc_insert<wabt::Type_const&>
                ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_78,(iterator)0x0,&local_80)
      ;
    }
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_40,(_anonymous_namespace_ *)&local_78,(TypeVector *)0x0,in_RCX);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x200ede);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_50 = *plVar4;
      lStack_48 = plVar3[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar4;
      local_60 = (long *)*plVar3;
    }
    local_58 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    PrintError(this,"%s",local_60);
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if (local_78 != (void *)0x0) {
      operator_delete(local_78,local_68 - (long)local_78);
    }
    RVar1.enum_ = Error;
  }
  RVar2 = DropTypes(this,1);
  RVar1.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::OnIndexedFuncRef(Index* out_index) {
  Type type;
  Result result = PeekType(0, &type);
  if (!(type == Type::Any || type.IsReferenceWithIndex())) {
    TypeVector actual;
    if (Succeeded(result)) {
      actual.push_back(type);
    }
    std::string message =
        "type mismatch in call_ref, expected reference but got " +
        TypesToString(actual);
    PrintError("%s", message.c_str());
    result = Result::Error;
  }
  if (Succeeded(result)) {
    *out_index = type.GetReferenceIndex();
  }
  result |= DropTypes(1);
  return result;
}